

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureBaseGL.cpp
# Opt level: O3

void __thiscall
Diligent::TextureBaseGL::TextureBaseGL
          (TextureBaseGL *this,IReferenceCounters *pRefCounters,
          FixedBlockMemoryAllocator *TexViewObjAllocator,RenderDeviceGLImpl *pDeviceGL,
          TextureDesc *TexDesc,bool bIsDeviceInternal)

{
  TextureBase<Diligent::EngineGLImplTraits>::TextureBase
            (&this->super_TextureBase<Diligent::EngineGLImplTraits>,pRefCounters,TexViewObjAllocator
             ,pDeviceGL,TexDesc,bIsDeviceInternal);
  (this->super_AsyncWritableResource).m_PendingMemoryBarriers = MEMORY_BARRIER_NONE;
  (this->super_TextureBase<Diligent::EngineGLImplTraits>).
  super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>.
  super_ObjectBase<Diligent::ITextureGL>.super_RefCountedObject<Diligent::ITextureGL>.
  super_ITextureGL.super_ITexture.super_IDeviceObject = (IDeviceObject)&PTR_QueryInterface_00af38c0;
  (this->m_GlTexture).m_uiHandle = 0;
  (this->m_GlTexture).m_CreateReleaseHelper = 0;
  *(undefined8 *)&(this->m_GlTexture).m_UniqueId = 0;
  (this->m_pPBO).m_pObject = (IBuffer *)0x0;
  this->m_BindTarget = 0;
  this->m_GLTexFormat = 0;
  return;
}

Assistant:

TextureBaseGL::TextureBaseGL(IReferenceCounters*        pRefCounters,
                             FixedBlockMemoryAllocator& TexViewObjAllocator,
                             RenderDeviceGLImpl*        pDeviceGL,
                             const TextureDesc&         TexDesc,
                             bool                       bIsDeviceInternal) :
    // clang-format off
    TTextureBase
    {
        pRefCounters,
        TexViewObjAllocator,
        pDeviceGL,
        TexDesc,
        bIsDeviceInternal
    },
    m_GlTexture  {false},
    m_BindTarget {0    },
    m_GLTexFormat{0    }
// clang-format on
{
}